

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O3

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,Index size,double reserveSizeFactor)

{
  Scalar *__src;
  Scalar *__dest;
  StorageIndex *__dest_00;
  undefined8 *puVar1;
  StorageIndex *__src_00;
  ulong uVar2;
  ulong uVar3;
  
  if (this->m_allocatedSize < size) {
    uVar2 = (long)((double)size * reserveSizeFactor) + size;
    if (0x7ffffffe < (long)uVar2) {
      uVar2 = 0x7fffffff;
    }
    if ((long)uVar2 < size) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = operator_delete;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __dest = (Scalar *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    __dest_00 = (StorageIndex *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    __src = this->m_values;
    uVar3 = this->m_size;
    if ((long)uVar2 <= this->m_size) {
      uVar3 = uVar2;
    }
    if ((long)uVar3 < 1) {
      __src_00 = this->m_indices;
    }
    else {
      memcpy(__dest,__src,uVar3 * 8);
      __src_00 = this->m_indices;
      memcpy(__dest_00,__src_00,uVar3 << 2);
    }
    this->m_values = __dest;
    this->m_indices = __dest_00;
    this->m_allocatedSize = uVar2;
    if (__src_00 != (StorageIndex *)0x0) {
      operator_delete__(__src_00);
    }
    if (__src != (Scalar *)0x0) {
      operator_delete__(__src);
    }
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(Index size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
      {
        Index realloc_size = (std::min<Index>)(NumTraits<StorageIndex>::highest(),  size + Index(reserveSizeFactor*double(size)));
        if(realloc_size<size)
          internal::throw_std_bad_alloc();
        reallocate(realloc_size);
      }
      m_size = size;
    }